

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O1

void __thiscall FatSystem::readFile(FatSystem *this,uint cluster,uint size,FILE *f,bool deleted)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  FILE *__s;
  uint uVar5;
  uint uVar6;
  FILE *pFVar7;
  long lVar8;
  undefined3 in_register_00000081;
  char *buffer;
  undefined1 auStack_58 [8];
  undefined1 *local_50;
  FILE *local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_38 = CONCAT31(in_register_00000081,deleted);
  local_50 = auStack_58;
  local_48 = (FILE *)f;
  if (f == (FILE *)0x0) {
    local_48 = _stdout;
  }
  local_34 = local_38;
  if (cluster != 0xffffffff && size != 0) {
    do {
      uVar1 = this->bytesPerCluster;
      uVar6 = size;
      if (uVar1 < (ulong)(long)(int)size) {
        uVar6 = (uint)uVar1;
      }
      buffer = local_50 + -(uVar1 + 0xf & 0xfffffffffffffff0);
      uVar2 = this->bytesPerSector;
      uVar3 = this->sectorsPerCluster;
      uVar4 = this->dataStart;
      lVar8 = this->rootEntries << 5;
      if (this->type != 1) {
        lVar8 = 0;
      }
      buffer[-8] = '\x1d';
      buffer[-7] = -0x1f;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      readData(this,lVar8 + (cluster - 2) * uVar2 * uVar3 + uVar4,buffer,uVar6);
      __s = local_48;
      uVar5 = size - uVar6;
      if (size == 0xffffffff) {
        uVar5 = size;
      }
      size = uVar5;
      buffer[-8] = 'D';
      buffer[-7] = -0x1f;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      pFVar7 = __s;
      fwrite(buffer,(long)(int)uVar6,1,__s);
      buffer[-8] = 'L';
      buffer[-7] = -0x1f;
      buffer[-6] = '\x10';
      buffer[-5] = '\0';
      buffer[-4] = '\0';
      buffer[-3] = '\0';
      buffer[-2] = '\0';
      buffer[-1] = '\0';
      fflush(__s);
      if ((local_34 & 1) == 0) {
        buffer[-8] = '{';
        buffer[-7] = -0x1f;
        buffer[-6] = '\x10';
        buffer[-5] = '\0';
        buffer[-4] = '\0';
        buffer[-3] = '\0';
        buffer[-2] = '\0';
        buffer[-1] = '\0';
        cluster = nextCluster(this,cluster,0);
        if (cluster == 0) {
          buffer[-8] = -0x75;
          buffer[-7] = -0x1f;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          readFile();
          local_34 = (uint)CONCAT71((int7)((ulong)pFVar7 >> 8),1);
          cluster = local_3c;
        }
      }
      else if ((char)local_38 == '\0') {
        buffer[-8] = -0x5e;
        buffer[-7] = -0x1f;
        buffer[-6] = '\x10';
        buffer[-5] = '\0';
        buffer[-4] = '\0';
        buffer[-3] = '\0';
        buffer[-2] = '\0';
        buffer[-1] = '\0';
        uVar6 = nextCluster(this,cluster,0);
        if (uVar6 == 0) {
          cluster = cluster + 1;
        }
        else {
          buffer[-8] = -0x2e;
          buffer[-7] = -0x1f;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          readFile();
          local_34 = 0;
          cluster = local_40;
        }
      }
      else {
        do {
          cluster = cluster + 1;
          buffer[-8] = 'h';
          buffer[-7] = -0x1f;
          buffer[-6] = '\x10';
          buffer[-5] = '\0';
          buffer[-4] = '\0';
          buffer[-3] = '\0';
          buffer[-2] = '\0';
          buffer[-1] = '\0';
          uVar6 = nextCluster(this,cluster,0);
        } while (uVar6 != 0);
      }
    } while ((size != 0) && (cluster != 0xffffffff));
  }
  return;
}

Assistant:

void FatSystem::readFile(unsigned int cluster, unsigned int size, FILE *f, bool deleted)
{
    bool contiguous = deleted;

    if (f == NULL) {
        f = stdout;
    }

    while ((size!=0) && cluster!=FAT_LAST) {
        int currentCluster = cluster;
        int toRead = size;
        if (toRead > bytesPerCluster || size < 0) {
            toRead = bytesPerCluster;
        }
#ifndef __WIN__
        char buffer[bytesPerCluster];
#else
                char *buffer = new char[bytesPerCluster];
                __try
                {
#endif
        readData(clusterAddress(cluster), buffer, toRead);

        if (size != -1) {
            size -= toRead;
        }

        // Write file data to the given file
        fwrite(buffer, toRead, 1, f);
        fflush(f);

        if (contiguous) {
            if (deleted) {
                do {
                    cluster++;
                } while (!freeCluster(cluster));
            } else {
                if (!freeCluster(cluster)) {
                    fprintf(stderr, "! Contiguous file contains cluster that seems allocated\n");
                    fprintf(stderr, "! Trying to disable contiguous mode\n");
                    contiguous = false;
                    cluster = nextCluster(cluster);
                } else {
                    cluster++;
                }
            }
        } else {
            cluster = nextCluster(currentCluster);

            if (cluster == 0) {
                fprintf(stderr, "! One of your file's cluster is 0 (maybe FAT is broken, have a look to -2 and -m)\n");
                fprintf(stderr, "! Trying to enable contigous mode\n");
                contiguous = true;
                cluster = currentCluster+1;
            }
        }
#ifdef __WIN__
    }
    __finally
    {
        delete[] buffer;
    }
#endif
    }
}